

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

sexp_conflict
sexp_hash_table_cell
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict ht,sexp_conflict obj,
          sexp_conflict createp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 hash_fn_00;
  undefined8 ctx_00;
  undefined8 uVar4;
  ulong in_RCX;
  ulong uVar5;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  long in_R9;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  sexp_uint_t size;
  sexp_conflict i;
  sexp_conflict hash_fn;
  sexp_conflict eq_fn;
  sexp_conflict buckets;
  sexp_conflict in_stack_ffffffffffffff88;
  sexp_conflict obj_00;
  sexp_conflict in_stack_ffffffffffffff90;
  sexp_conflict hash_fn_01;
  sexp_conflict psVar6;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 oldbuckets;
  undefined8 ctx_01;
  undefined8 local_8;
  
  psVar6 = (sexp_conflict)&DAT_0000043e;
  memset(&stack0xffffffffffffff88,0,0x10);
  if ((in_RCX & 3) == 0) {
    ctx_01 = *(undefined8 *)(in_RCX + 8);
    uVar4 = *(undefined8 *)(in_RCX + 0x20);
    oldbuckets = *(undefined8 *)(in_RCX + 0x18);
    hash_fn_00 = sexp_get_bucket((sexp_conflict)in_stack_ffffffffffffffa0,psVar6,
                                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    psVar6 = sexp_scan_bucket((sexp_conflict)in_stack_ffffffffffffffa0,psVar6,
                              in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (psVar6 == (sexp_conflict)0x3e) {
      local_8 = (sexp_conflict)0x3e;
      if (in_R9 != 0x3e) {
        obj_00 = (sexp_conflict)&stack0xffffffffffffff98;
        hash_fn_01 = *(sexp_conflict *)(in_RDI + 0x6080);
        *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff88;
        auVar1._8_8_ = (long)*(ulong *)(in_RCX + 0x10) >> 0x3f;
        auVar1._0_8_ = *(ulong *)(in_RCX + 0x10) & 0xfffffffffffffffe;
        ctx_00 = SUB168(auVar1 / SEXT816(2),0);
        uVar5 = (((sexp)ctx_01)->value).stack.length >> 2;
        if (uVar5 <= (ulong)(ctx_00 * 3) && ctx_00 * 3 - uVar5 != 0) {
          sexp_regrow_hash_table
                    ((sexp_conflict)ctx_01,(sexp_conflict)uVar4,(sexp_conflict)oldbuckets,
                     (sexp_conflict)hash_fn_00);
          ctx_01 = *(undefined8 *)(in_RCX + 8);
          hash_fn_00 = sexp_get_bucket((sexp_conflict)ctx_00,psVar6,hash_fn_01,obj_00);
        }
        local_8 = sexp_cons_op(in_RDI,0,2,in_R8,in_R9);
        auVar2._8_8_ = (long)hash_fn_00 >> 0x3f;
        auVar2._0_8_ = hash_fn_00 & 0xfffffffffffffffe;
        uVar4 = sexp_cons_op(in_RDI,0,2,local_8,
                             *(undefined8 *)
                              ((long)&((sexp)ctx_01)->value + SUB168(auVar2 / SEXT816(2),0) * 8 + 8)
                            );
        auVar3._8_8_ = (long)hash_fn_00 >> 0x3f;
        auVar3._0_8_ = hash_fn_00 & 0xfffffffffffffffe;
        *(undefined8 *)((long)&((sexp)ctx_01)->value + SUB168(auVar3 / SEXT816(2),0) * 8 + 8) =
             uVar4;
        *(ulong *)(in_RCX + 0x10) = (long)((long)&((sexp)ctx_00)->tag + 1) * 2 | 1;
        *(sexp_conflict *)(in_RDI + 0x6080) = hash_fn_01;
      }
    }
    else {
      local_8 = (psVar6->value).flonum;
    }
  }
  else {
    local_8 = sexp_xtype_exception(in_RDI,in_RSI,"not a Hash-Table",in_RCX);
  }
  return (sexp_conflict)local_8;
}

Assistant:

sexp sexp_hash_table_cell (sexp ctx, sexp self, sexp_sint_t n, sexp ht, sexp obj, sexp createp) {
  sexp buckets, eq_fn, hash_fn, i;
  sexp_uint_t size;
  sexp_gc_var1(res);
  /* extra check - exact type should be checked by the calling procedure */
  if (! sexp_pointerp(ht))
    return sexp_xtype_exception(ctx, self, "not a Hash-Table", ht);
  buckets = sexp_hash_table_buckets(ht);
  eq_fn = sexp_hash_table_eq_fn(ht);
  hash_fn = sexp_hash_table_hash_fn(ht);
  i = sexp_get_bucket(ctx, buckets, hash_fn, obj);
  res = sexp_scan_bucket(ctx, sexp_vector_ref(buckets, i), obj, eq_fn);
  if (sexp_truep(res)) {
    res = sexp_car(res);
  } else if (sexp_truep(createp)) {
    sexp_gc_preserve1(ctx, res);
    size = sexp_unbox_fixnum(sexp_hash_table_size(ht));
    if (sexp_hash_resize_check(size, sexp_vector_length(buckets))) {
      sexp_regrow_hash_table(ctx, ht, buckets, hash_fn);
      buckets = sexp_hash_table_buckets(ht);
      i = sexp_get_bucket(ctx, buckets, hash_fn, obj);
    }
    res = sexp_cons(ctx, obj, createp);
    sexp_vector_set(buckets, i, sexp_cons(ctx, res, sexp_vector_ref(buckets, i)));
    sexp_hash_table_size(ht) = sexp_make_fixnum(size+1);
    sexp_gc_release1(ctx);
  }
  return res;
}